

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>,_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::_::Void> depResult;
  Exception local_5a8;
  NullableValue<kj::Exception> local_450;
  char local_2f0;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> local_2e8;
  Exception local_178;
  
  local_450.isSet = false;
  local_2f0 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_450);
  if (local_450.isSet == true) {
    Exception::Exception(&local_178,&local_450.field_1.value);
    local_5a8.ownFile.content.ptr = local_178.ownFile.content.ptr;
    local_5a8.ownFile.content.size_ = local_178.ownFile.content.size_;
    local_5a8.ownFile.content.disposer = local_178.ownFile.content.disposer;
    local_178.ownFile.content.ptr = (char *)0x0;
    local_178.ownFile.content.size_ = 0;
    local_5a8.file = local_178.file;
    local_5a8.line = local_178.line;
    local_5a8.type = local_178.type;
    local_5a8.description.content.ptr = local_178.description.content.ptr;
    local_5a8.description.content.size_ = local_178.description.content.size_;
    local_178.description.content.ptr = (char *)0x0;
    local_178.description.content.size_ = 0;
    local_5a8.description.content.disposer = local_178.description.content.disposer;
    local_5a8.context.ptr.disposer = local_178.context.ptr.disposer;
    local_5a8.context.ptr.ptr = local_178.context.ptr.ptr;
    local_178.context.ptr.ptr = (Context *)0x0;
    memcpy(local_5a8.trace,local_178.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_2e8,&local_5a8);
    local_2e8.value.ptr.disposer = (Disposer *)0x0;
    local_2e8.value.ptr.ptr = (AsyncIoStream *)0x0;
    Exception::~Exception(&local_5a8);
    ExceptionOr<kj::Own<kj::AsyncIoStream>_>::operator=
              ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)output,&local_2e8);
    ExceptionOr<kj::Own<kj::AsyncIoStream>_>::~ExceptionOr(&local_2e8);
    Exception::~Exception(&local_178);
  }
  else if (local_2f0 == '\x01') {
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>
    ::operator()<>((CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_c__:1955:35),_kj::Own<kj::AsyncCapabilityStream>_>
                    *)&local_5a8);
    local_2e8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_2e8.value.ptr.disposer = (Disposer *)local_5a8.ownFile.content.ptr;
    local_2e8.value.ptr.ptr = (AsyncIoStream *)local_5a8.ownFile.content.size_;
    local_5a8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Own<kj::AsyncIoStream>_>::operator=
              ((ExceptionOr<kj::Own<kj::AsyncIoStream>_> *)output,&local_2e8);
    ExceptionOr<kj::Own<kj::AsyncIoStream>_>::~ExceptionOr(&local_2e8);
    Own<kj::AsyncIoStream>::dispose((Own<kj::AsyncIoStream> *)&local_5a8);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_450);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }